

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O1

void __thiscall
r_exec::IPGMContext::getMember
          (IPGMContext *this,void **object,uint64_t *view_oid,ObjectType *object_type,
          int16_t *member_index)

{
  Atom *pAVar1;
  ulong *puVar2;
  ObjectType *pOVar3;
  int16_t *piVar4;
  char cVar5;
  byte bVar6;
  uint16_t uVar7;
  uint16_t index;
  int16_t iVar8;
  uint uVar9;
  Group *pGVar10;
  ulong uVar11;
  IPGMContext cptr;
  IPGMContext IStack_138;
  Code *local_108;
  View *pVStack_100;
  IPGMContext local_f8;
  ulong *local_c8;
  ObjectType *local_c0;
  int16_t *local_b8;
  IPGMContext local_b0;
  string local_80;
  IPGMContext local_60;
  
  cVar5 = r_code::Atom::getDescriptor();
  if (cVar5 == -0x7c) {
    local_108 = this->object;
    pVStack_100 = this->view;
    pAVar1 = (this->super__Context).code;
    local_f8.super__Context.index = r_code::Atom::asIndex();
    local_f8.super__Context.overlay = (this->super__Context).overlay;
    local_f8.super__Context.data = (this->super__Context).data;
    local_f8.super__Context._vptr__Context = (_func_int **)&PTR___Context_001be3f0;
    local_f8.object = local_108;
    local_f8.view = pVStack_100;
    local_f8.super__Context.code = pAVar1;
    cVar5 = r_code::Atom::getDescriptor();
    if (cVar5 == -0x40) {
      getChild(&local_b0,&local_f8,1);
      local_c8 = view_oid;
      local_c0 = object_type;
      local_b8 = member_index;
      operator*(&IStack_138,&local_b0);
      uVar7 = getChildrenCount(&local_f8);
      local_108 = (Code *)(ulong)uVar7;
      if (2 < uVar7) {
        uVar11 = 8;
        do {
          cVar5 = r_code::Atom::getDescriptor();
          if (cVar5 == -0x6f) {
            IStack_138.super__Context.code = (Atom *)&((IStack_138.view)->super_View).field_0x28;
            IStack_138.super__Context.index = 0;
            IStack_138.super__Context.data = VIEW;
          }
          else {
            index = r_code::Atom::asIndex();
            getChild(&local_60,&IStack_138,index);
            operator*(&local_b0,&local_60);
            IStack_138.object = local_b0.object;
            IStack_138.view = local_b0.view;
            IStack_138.super__Context.code = local_b0.super__Context.code;
            IStack_138.super__Context.index = local_b0.super__Context.index;
            IStack_138.super__Context.data = local_b0.super__Context.data;
          }
          uVar11 = uVar11 + 4;
        } while ((uint)uVar7 * 4 != uVar11);
      }
      bVar6 = r_code::Atom::getDescriptor();
      piVar4 = local_b8;
      pOVar3 = local_c0;
      puVar2 = local_c8;
      uVar9 = bVar6 - 0xc1;
      if (uVar9 < 0xe) {
        if ((0x3f0cU >> (uVar9 & 0x1f) & 1) == 0) {
          if ((0x83U >> (uVar9 & 0x1f) & 1) == 0) goto LAB_0015dc49;
          if (IStack_138.super__Context.data == VALUE_ARRAY) {
            local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"IPGMContext","");
            debug(&local_80);
            DebugStream::operator<<((DebugStream *)&local_b0,"This will never work, aborting");
            DebugStream::~DebugStream((DebugStream *)&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p);
            }
            r_code::Atom::trace();
            exit(0);
          }
          pGVar10 = r_exec::View::get_host(IStack_138.view);
          *object = pGVar10;
          *puVar2 = (ulong)*(uint *)(IStack_138.super__Context.code +
                                    (ulong)IStack_138.super__Context.index * 4 + 0x30);
          *pOVar3 = TYPE_VIEW;
        }
        else {
          *local_c0 = TYPE_OBJECT;
          *object = IStack_138.object;
        }
        iVar8 = r_code::Atom::asIndex();
        *piVar4 = iVar8;
        return;
      }
LAB_0015dc49:
      *object = (void *)0x0;
      *local_c0 = TYPE_UNDEFINED;
      return;
    }
  }
  *object = (void *)0x0;
  *object_type = TYPE_UNDEFINED;
  *member_index = 0;
  return;
}

Assistant:

void IPGMContext::getMember(void *&object, uint64_t &view_oid, ObjectType &object_type, int16_t &member_index) const
{
    if ((*this)[0].getDescriptor() != Atom::I_PTR) { // ill-formed mod/set expression.
        object = nullptr;
        object_type = TYPE_UNDEFINED;
        member_index = 0;
        return;
    }

    IPGMContext cptr = IPGMContext(this->object, view, code, (*this)[0].asIndex(), (InputLessPGMOverlay *)overlay, data); // dereference manually (1 offset) to retain the cptr as is.

    if (cptr[0].getDescriptor() != Atom::C_PTR) { // ill-formed mod/set expression.
        object = nullptr;
        object_type = TYPE_UNDEFINED;
        member_index = 0;
        return;
    }

    IPGMContext c = *cptr.getChild(1); // this, vl_ptr, value_ptr or rptr.
    uint16_t atom_count = cptr.getChildrenCount();

    for (uint16_t i = 2; i < atom_count; ++i) { // stop before the last iptr.
        if (cptr[i].getDescriptor() == Atom::VIEW) {
            c = IPGMContext(c.getObject(), c.view, &c.view->code(0), 0, nullptr, VIEW);
        } else {
            c = *c.getChild(cptr[i].asIndex());
        }
    }

    // at this point, c is an iptr dereferenced to an object or a view; the next iptr holds the member index.
    // c is pointing at the first atom of an object or a view.
    switch (c[0].getDescriptor()) {
    case Atom::OBJECT:
    case Atom::MARKER:
    case Atom::INSTANTIATED_PROGRAM:
    case Atom::INSTANTIATED_CPP_PROGRAM:
    case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
    case Atom::INSTANTIATED_ANTI_PROGRAM:
    case Atom::COMPOSITE_STATE:
    case Atom::MODEL:
        object_type = TYPE_OBJECT;
        object = c.getObject();
        break;

    case Atom::GROUP:
    case Atom::SET: // dynamically generated views can be sets.
    case Atom::S_SET: // views are always copied; set the object to the view's group on which to perform an operation for the view's oid.
        if (c.data == VALUE_ARRAY) {
            // FIXME: I'm not sure how this could ever have worked
            debug("IPGMContext") << "This will never work, aborting";
            c[VIEW_CODE_MAX_SIZE].trace();
            exit(0);
            object = (Group *)c[VIEW_CODE_MAX_SIZE].atom; // first reference of grp in a view stored in athe value array.
        } else {
            object = c.view->get_host();
        }

        view_oid = c[VIEW_OID].atom; // oid is hidden at the end of the view code; stored directly as a uint64.
        object_type = TYPE_VIEW;
        break;

    default: // atomic value or ill-formed mod/set expression.
        object = nullptr;
        object_type = TYPE_UNDEFINED;
        return;
    }

    // get the index held by the last iptr.
    member_index = cptr[atom_count].asIndex();
}